

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_packuswb_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  
  uVar3 = d->_w_MMXReg[0];
  if (0xfe < (short)d->_w_MMXReg[0]) {
    uVar3 = 0xff;
  }
  uVar6 = '\0';
  if ((short)uVar3 < 1) {
    uVar3 = 0;
  }
  uVar2 = d->_w_MMXReg[1];
  if (0xfe < (short)uVar2) {
    uVar2 = 0xff;
  }
  uVar7 = (uint8_t)uVar2;
  if ((short)uVar2 < 1) {
    uVar7 = uVar6;
  }
  uVar2 = d->_w_MMXReg[2];
  if (0xfe < (short)uVar2) {
    uVar2 = 0xff;
  }
  uVar8 = (uint8_t)uVar2;
  if ((short)uVar2 < 1) {
    uVar8 = uVar6;
  }
  uVar2 = d->_w_MMXReg[3];
  if (0xfe < (short)uVar2) {
    uVar2 = 0xff;
  }
  uVar9 = (uint8_t)uVar2;
  if ((short)uVar2 < 1) {
    uVar9 = uVar6;
  }
  uVar2 = s->_w_MMXReg[0];
  if (0xfe < (short)uVar2) {
    uVar2 = 0xff;
  }
  uVar10 = (uint8_t)uVar2;
  if ((short)uVar2 < 1) {
    uVar10 = uVar6;
  }
  uVar2 = s->_w_MMXReg[1];
  if (0xfe < (short)uVar2) {
    uVar2 = 0xff;
  }
  uVar4 = (uint8_t)uVar2;
  if ((short)uVar2 < 1) {
    uVar4 = uVar6;
  }
  uVar2 = s->_w_MMXReg[2];
  if (0xfe < (short)uVar2) {
    uVar2 = 0xff;
  }
  uVar5 = (uint8_t)uVar2;
  if ((short)uVar2 < 1) {
    uVar5 = uVar6;
  }
  uVar2 = 0xff;
  if ((short)s->_w_MMXReg[3] < 0xff) {
    uVar2 = s->_w_MMXReg[3];
  }
  uVar1 = (uint8_t)uVar2;
  if ((short)uVar2 < 1) {
    uVar1 = uVar6;
  }
  d->_b_MMXReg[0] = (uint8_t)uVar3;
  d->_b_MMXReg[1] = uVar7;
  d->_b_MMXReg[2] = uVar8;
  d->_b_MMXReg[3] = uVar9;
  d->_b_MMXReg[4] = uVar10;
  d->_b_MMXReg[5] = uVar4;
  d->_b_MMXReg[6] = uVar5;
  d->_b_MMXReg[7] = uVar1;
  return;
}

Assistant:

static inline int satub(int x)
{
    if (x < 0) {
        return 0;
    } else if (x > 255) {
        return 255;
    } else {
        return x;
    }
}